

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O3

size_t intersect_accel<true,false,true>(Ray *ray,Accel *accel,TraversalStats *stats)

{
  Vec<float,_3UL> *pVVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  Index IVar5;
  pointer pNVar6;
  pointer pPVar7;
  undefined1 auVar8 [16];
  byte bVar9;
  ulong uVar10;
  byte bVar11;
  int iVar12;
  Index IVar13;
  size_t sVar14;
  long lVar15;
  Index IVar16;
  size_t i;
  ulong uVar17;
  Index IVar18;
  int iVar19;
  uint uVar20;
  undefined1 auVar21 [16];
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  float fVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  float fVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  size_t local_208;
  undefined8 local_1f8;
  undefined4 local_1f0;
  ulong local_1e8;
  ulong local_1e0;
  ulong local_1d8;
  ulong local_1d0;
  ulong local_1c8;
  ulong local_1c0;
  TraversalStats *local_1b8;
  Vec<float,_3UL> *local_1b0;
  undefined8 local_1a8;
  float local_1a0;
  undefined1 local_198 [16];
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  undefined1 local_148 [8];
  float fStack_140;
  float fStack_13c;
  Type local_134 [64];
  uint local_34;
  
  auVar30._8_4_ = 0x3f800000;
  auVar30._0_8_ = 0x3f8000003f800000;
  auVar30._12_4_ = 0x3f800000;
  uVar17 = *(ulong *)(ray->dir).values;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = uVar17;
  fVar23 = (ray->dir).values[2];
  local_1b0 = &ray->dir;
  local_208 = 0xffffffffffffffff;
  local_188 = 1.0 / fVar23;
  iVar19 = vextractps_avx(auVar34,1);
  uVar20 = vmovmskps_avx(ZEXT416((uint)fVar23));
  auVar30 = vdivps_avx(auVar30,auVar34);
  local_134[0] = (((accel->bvh).nodes.
                   super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->index).value;
  auVar21._8_4_ = 0x7fffffff;
  auVar21._0_8_ = 0x7fffffff7fffffff;
  auVar21._12_4_ = 0x7fffffff;
  auVar21 = vandps_avx512vl(auVar30,auVar21);
  auVar8._8_4_ = 0x7f800000;
  auVar8._0_8_ = 0x7f8000007f800000;
  auVar8._12_4_ = 0x7f800000;
  uVar10 = vpcmpd_avx512vl(auVar21,auVar8,1);
  local_158 = auVar30._0_4_;
  _local_148 = vmovshdup_avx(auVar30);
  bVar11 = (byte)((uVar10 & 0xf) >> 1);
  bVar9 = (byte)(uVar10 & 0xf);
  local_168._4_12_ = auVar30._4_12_;
  local_168._0_4_ =
       (uint)(bVar9 & 1) * ((int)local_158 + 2) + (uint)!(bool)(bVar9 & 1) * (int)local_158;
  local_178._4_12_ = local_148._4_12_;
  local_178._0_4_ =
       (uint)(bVar11 & 1) * (local_148._0_4_ + 2) + (uint)!(bool)(bVar11 & 1) * local_148._0_4_;
  local_34 = 1;
  iVar12 = (int)uVar17 >> 0x1f;
  local_198 = ZEXT416((uint)((uint)ABS(local_188) < 0x7f800000) * ((int)local_188 + 2) +
                      (uint)((uint)ABS(local_188) >= 0x7f800000) * (int)local_188);
  local_1d0 = (ulong)((-(iVar19 >> 0x1f) + 2U) * 4);
  local_1d8 = (ulong)(((uVar20 & 1) + 4) * 4);
  local_1c0 = (ulong)((-(iVar19 >> 0x1f) ^ 3U) << 2);
  local_1c8 = (ulong)((uVar20 & 1 ^ 5) << 2);
  local_1e0 = (ulong)(uint)(iVar12 * -4);
  local_1e8 = (ulong)((-iVar12 ^ 1U) << 2);
  local_1b8 = stats;
  fStack_184 = local_188;
  fStack_180 = local_188;
  fStack_17c = local_188;
  fStack_154 = local_158;
  fStack_150 = local_158;
  fStack_14c = local_158;
  do {
    fVar23 = (ray->org).values[0];
    auVar24._4_4_ = fVar23;
    auVar24._0_4_ = fVar23;
    auVar24._8_4_ = fVar23;
    auVar24._12_4_ = fVar23;
    fVar22 = (ray->org).values[1];
    auVar27._4_4_ = fVar22;
    auVar27._0_4_ = fVar22;
    auVar27._8_4_ = fVar22;
    auVar27._12_4_ = fVar22;
    fVar26 = (ray->org).values[2];
    auVar29._4_4_ = fVar26;
    auVar29._0_4_ = fVar26;
    auVar29._8_4_ = fVar26;
    auVar29._12_4_ = fVar26;
    fVar4 = ray->tmin;
    auVar31._4_4_ = fVar4;
    auVar31._0_4_ = fVar4;
    auVar31._8_4_ = fVar4;
    auVar31._12_4_ = fVar4;
    fVar4 = ray->tmax;
    pNVar6 = (accel->bvh).nodes.
             super__Vector_base<bvh::v2::Node<float,_3UL,_32UL,_4UL>,_std::allocator<bvh::v2::Node<float,_3UL,_32UL,_4UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    sVar14 = local_1b8->visited_nodes;
LAB_001078b7:
    local_34 = local_34 - 1;
    IVar16.value = local_134[local_34];
    uVar20 = IVar16.value & 0xf;
    if (uVar20 == 0) {
      do {
        uVar20 = IVar16.value >> 4;
        auVar30 = vminss_avx(ZEXT416((uint)(local_168._0_4_ *
                                           (*(float *)((long)(pNVar6 + uVar20) + local_1e8) - fVar23
                                           ))),ZEXT416((uint)fVar4));
        auVar30 = vminss_avx(ZEXT416((uint)(local_178._0_4_ *
                                           (*(float *)((long)(pNVar6 + uVar20) + local_1c0) - fVar22
                                           ))),auVar30);
        auVar8 = vminss_avx(ZEXT416((uint)(local_198._0_4_ *
                                          (*(float *)((long)(pNVar6 + uVar20) + local_1c8) - fVar26)
                                          )),auVar30);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar6 + uVar20) + local_1d8)),
                                ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar20 + 1) + local_1d8)),
                                0x10);
        auVar21 = vminss_avx(ZEXT416((uint)(local_168._0_4_ *
                                           (*(float *)((long)(pNVar6 + (ulong)uVar20 + 1) +
                                                      local_1e8) - fVar23))),ZEXT416((uint)fVar4));
        auVar34 = vminss_avx(ZEXT416((uint)(local_178._0_4_ *
                                           (*(float *)((long)(pNVar6 + (ulong)uVar20 + 1) +
                                                      local_1c0) - fVar22))),auVar21);
        auVar21 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar6 + uVar20) + local_1e0)),
                                ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar20 + 1) + local_1e0)),
                                0x10);
        auVar30 = vsubps_avx(auVar30,auVar29);
        auVar36._0_4_ = auVar30._0_4_ * local_188;
        auVar36._4_4_ = auVar30._4_4_ * fStack_184;
        auVar36._8_4_ = auVar30._8_4_ * fStack_180;
        auVar36._12_4_ = auVar30._12_4_ * fStack_17c;
        auVar34 = vminss_avx(ZEXT416((uint)(local_198._0_4_ *
                                           (*(float *)((long)(pNVar6 + (ulong)uVar20 + 1) +
                                                      local_1c8) - fVar26))),auVar34);
        auVar30 = vinsertps_avx(ZEXT416(*(uint *)((long)(pNVar6 + uVar20) + local_1d0)),
                                ZEXT416(*(uint *)((long)(pNVar6 + (ulong)uVar20 + 1) + local_1d0)),
                                0x10);
        auVar21 = vsubps_avx(auVar21,auVar24);
        auVar32._0_4_ = auVar21._0_4_ * local_158;
        auVar32._4_4_ = auVar21._4_4_ * fStack_154;
        auVar32._8_4_ = auVar21._8_4_ * fStack_150;
        auVar32._12_4_ = auVar21._12_4_ * fStack_14c;
        auVar30 = vsubps_avx(auVar30,auVar27);
        auVar35._0_4_ = auVar30._0_4_ * (float)local_148._0_4_;
        auVar35._4_4_ = auVar30._4_4_ * (float)local_148._4_4_;
        auVar35._8_4_ = auVar30._8_4_ * fStack_140;
        auVar35._12_4_ = auVar30._12_4_ * fStack_13c;
        auVar30 = vmaxps_avx(auVar32,auVar31);
        auVar30 = vmaxps_avx(auVar35,auVar30);
        auVar30 = vmaxps_avx(auVar36,auVar30);
        auVar21 = vmovshdup_avx(auVar30);
        fVar33 = auVar21._0_4_;
        if (auVar30._0_4_ <= auVar8._0_4_) {
          IVar16.value = ((Index *)((long)(pNVar6 + uVar20) + 0x18))->value;
          if (fVar33 <= auVar34._0_4_) {
            uVar17 = (ulong)local_34;
            if (0x3f < uVar17) {
              local_1b8->visited_nodes = sVar14 + 1;
              __assert_fail("!is_full()",
                            "/workspace/llm4binary/github/license_c_cmakelists/madmann91[P]bvh/src/bvh/v2/stack.h"
                            ,0x15,
                            "void bvh::v2::SmallStack<bvh::v2::Index<32, 4>, 64>::push(const T &) [T = bvh::v2::Index<32, 4>, Capacity = 64]"
                           );
            }
            IVar5.value = ((Index *)((long)(pNVar6 + (ulong)uVar20 + 1) + 0x18))->value;
            IVar13.value = IVar5.value;
            IVar18.value = IVar16.value;
            if (auVar30._0_4_ <= fVar33) {
              IVar13.value = IVar16.value;
              IVar18.value = IVar5.value;
            }
            IVar16.value = IVar13.value;
            local_34 = local_34 + 1;
            local_134[uVar17] = IVar18.value;
          }
        }
        else {
          if (auVar34._0_4_ < fVar33) goto LAB_00107a34;
          IVar16.value = ((Index *)((long)(pNVar6 + (ulong)uVar20 + 1) + 0x18))->value;
        }
        sVar14 = sVar14 + 1;
        uVar20 = IVar16.value & 0xf;
        if (uVar20 != 0) {
          local_1b8->visited_nodes = sVar14;
          break;
        }
      } while( true );
    }
    local_1b8->visited_leaves = local_1b8->visited_leaves + 1;
    uVar17 = (ulong)(IVar16.value >> 4);
    do {
      pPVar7 = (accel->tris).
               super__Vector_base<bvh::v2::PrecomputedTri<float>,_std::allocator<bvh::v2::PrecomputedTri<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = *(ulong *)(ray->org).values;
      sVar14 = (accel->bvh).prim_ids.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      pVVar1 = &pPVar7[sVar14].n;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = *(ulong *)(((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values;
      auVar21 = vsubps_avx(auVar25,auVar28);
      local_1a0 = (((PrecomputedTri<float> *)(pVVar1 + -3))->p0).values[2] - (ray->org).values[2];
      local_1a8 = vmovlps_avx(auVar21);
      auVar30 = vmovshdup_avx(auVar21);
      fVar23 = (ray->dir).values[2];
      fVar22 = (ray->dir).values[0];
      fVar26 = (ray->dir).values[1];
      auVar8 = vfmsub231ss_fma(ZEXT416((uint)(auVar30._0_4_ * fVar23)),ZEXT416((uint)fVar26),
                               ZEXT416((uint)local_1a0));
      auVar34 = vfmsub231ss_fma(ZEXT416((uint)(local_1a0 * fVar22)),auVar21,ZEXT416((uint)fVar23));
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)(auVar21._0_4_ * fVar26)),ZEXT416((uint)fVar22),
                                auVar30);
      auVar30 = vinsertps_avx(auVar8,auVar34,0x10);
      local_1f8 = vmovlps_avx(auVar30);
      local_1f0 = auVar21._0_4_;
      fVar22 = std::
               transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                         (0,pVVar1,pPVar7 + sVar14 + 1,local_1b0);
      fVar23 = 0.0;
      lVar15 = 0;
      do {
        pfVar2 = (float *)((long)&local_1f8 + lVar15);
        pfVar3 = (float *)((long)pPVar7[sVar14].e2.values + lVar15);
        lVar15 = lVar15 + 4;
        fVar23 = fVar23 + *pfVar2 * *pfVar3;
      } while (lVar15 != 0xc);
      fVar26 = 0.0;
      lVar15 = 0;
      do {
        pfVar2 = (float *)((long)&local_1f8 + lVar15);
        pfVar3 = (float *)((long)pPVar7[sVar14].e1.values + lVar15);
        lVar15 = lVar15 + 4;
        fVar26 = fVar26 + *pfVar2 * *pfVar3;
      } while (lVar15 != 0xc);
      fVar22 = 1.0 / fVar22;
      if (((-1.1920929e-07 <= fVar22 * fVar23) && (-1.1920929e-07 <= fVar22 * fVar26)) &&
         (-1.1920929e-07 <= (1.0 - fVar22 * fVar23) - fVar22 * fVar26)) {
        fVar23 = std::
                 transform_reduce<float_const*,float_const*,float,std::plus<void>,std::multiplies<void>>
                           (0,pVVar1,pPVar7 + sVar14 + 1,&local_1a8);
        fVar23 = fVar23 * fVar22;
        if ((ray->tmin <= fVar23) && (fVar23 <= ray->tmax)) {
          ray->tmax = fVar23;
          local_208 = sVar14;
        }
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 != uVar20 + (IVar16.value >> 4));
    if (local_34 == 0) {
      return local_208;
    }
  } while( true );
LAB_00107a34:
  sVar14 = sVar14 + 1;
  local_1b8->visited_nodes = sVar14;
  if (local_34 == 0) {
    return local_208;
  }
  goto LAB_001078b7;
}

Assistant:

static size_t intersect_accel(Ray& ray, const Accel& accel, TraversalStats& stats) {
    size_t prim_id = invalid_id;
    bvh::v2::SmallStack<Bvh::Index, stack_size> stack;
    accel.bvh.intersect<false, UseRobustTraversal>(ray, accel.bvh.get_root().index, stack,
        [&] (size_t begin, size_t end) {
            if constexpr (CaptureStats)
                stats.visited_leaves++;
            for (size_t i = begin; i < end; ++i) {
                size_t j = PermutePrims ? i : accel.bvh.prim_ids[i];
                if (auto hit = accel.tris[j].intersect(ray)) {
                    ray.tmax = std::get<0>(*hit);
                    prim_id = j;
                }
            }
            return prim_id != invalid_id;
        },
        [&] (auto&&, auto&&) {
            if constexpr (CaptureStats)
                stats.visited_nodes++;
        });
    return prim_id;
}